

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O1

void __thiscall eval_bin_op_Test::TestBody(eval_bin_op_Test *this)

{
  size_t *this_00;
  int iVar1;
  size_t __i;
  long lVar2;
  result_type rVar3;
  long lVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var5;
  ulong uVar6;
  long lVar7;
  uint64_t right_value;
  char *pcVar8;
  long lVar9;
  uint64_t left_value;
  initializer_list<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_> __l;
  undefined1 local_1600 [8];
  mt19937 rnd;
  AssertionResult gtest_ar;
  undefined8 local_b8;
  undefined8 uStack_b0;
  code *local_a8 [2];
  undefined1 local_98 [8];
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  func_map;
  AssertHelper local_60;
  void *local_58;
  ulong local_50;
  long gold;
  unsigned_long local_40;
  uint64_t result;
  
  lVar2 = 1;
  uVar6 = 0x1571;
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar2);
    rnd._M_x[lVar2 + -1] = uVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_1600 = (undefined1  [8])0x2a;
  lVar2 = 1;
  uVar6 = 0x2a;
  do {
    uVar6 = (ulong)(((uint)(uVar6 >> 0x1e) ^ (uint)uVar6) * 0x6c078965 + (int)lVar2);
    rnd._M_x[lVar2 + -1] = uVar6;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  rnd._M_x[0x26f] = 0x270;
  gold = (long)operator_new(0x1a40);
  memset((void *)gold,0,0x1a40);
  local_58 = operator_new(0x1a40);
  lVar2 = 0;
  memset(local_58,0,0x1a40);
  do {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_1600);
    lVar9 = rVar3 % 0x3ff - 0x1ff;
    do {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)local_1600);
      lVar4 = rVar3 % 0x3ff - 0x1ff;
    } while (lVar4 == 0);
    lVar7 = lVar2 * 0x10;
    *(long *)(gold + lVar7) = lVar9;
    *(long *)(gold + 8 + lVar7) = lVar4;
    *(ulong *)((long)local_58 + lVar7) = (ulong)((uint)lVar9 & 0x3ff);
    *(ulong *)((long)local_58 + lVar7 + 8) = (ulong)((uint)lVar4 & 0x3ff);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x1a4);
  rnd._M_p = 7;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_a8[1] = std::
                _Function_handler<long_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc:272:28)>
                ::_M_invoke;
  local_a8[0] = std::
                _Function_handler<long_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc:272:28)>
                ::_M_manager;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&rnd._M_p;
  std::
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  ::map((map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
         *)local_98,__l,(less<kratos::ExprOp> *)&local_40,(allocator_type *)&local_50);
  lVar2 = 0;
  do {
    if (*(code **)((long)local_a8 + lVar2) != (code *)0x0) {
      (**(code **)((long)local_a8 + lVar2))((long)&local_b8 + lVar2,(long)&local_b8 + lVar2,3);
    }
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x1e0);
  if (func_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&func_map) {
    this_00 = &rnd._M_p;
    p_Var5 = func_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      func_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&p_Var5[1]._M_parent;
      lVar2 = 8;
      do {
        rnd._M_p = *(size_t *)(gold + -8 + lVar2);
        local_40 = *(unsigned_long *)(gold + lVar2);
        if (p_Var5[1]._M_right == (_Base_ptr)0x0) {
          std::__throw_bad_function_call();
        }
        local_50 = (**(code **)(p_Var5 + 2))
                             (func_map._M_t._M_impl.super__Rb_tree_header._M_node_count,this_00,
                              &local_40);
        local_40 = kratos::eval_bin_op(*(uint64_t *)((long)local_58 + lVar2 + -8),
                                       *(uint64_t *)((long)local_58 + lVar2),*(ExprOp *)(p_Var5 + 1)
                                       ,10,true);
        uVar6 = -local_50;
        if (0 < (long)local_50) {
          uVar6 = local_50;
        }
        if (((long)local_50 < 0) || (0x3ff < uVar6)) {
          local_50 = (ulong)((uint)local_50 & 0x3ff);
        }
        testing::internal::CmpHelperEQ<long,unsigned_long>
                  ((internal *)this_00,"gold","result",(long *)&local_50,&local_40);
        if ((char)rnd._M_p == '\0') {
          testing::Message::Message((Message *)&result);
          pcVar8 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar8 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc"
                     ,0x11c,pcVar8);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&result);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if (result != 0) {
            (**(code **)(*(long *)result + 8))();
          }
        }
        if (gtest_ar._0_8_ != 0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&gtest_ar,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       gtest_ar._0_8_);
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x1a48);
      lVar2 = 8;
      do {
        right_value = *(long *)(gold + lVar2) + 0x1ff;
        if (right_value != 0) {
          left_value = *(long *)(gold + -8 + lVar2) + 0x1ff;
          rnd._M_p = left_value;
          local_40 = right_value;
          if (p_Var5[1]._M_right == (_Base_ptr)0x0) {
            std::__throw_bad_function_call();
          }
          pcVar8 = (char *)(**(code **)(p_Var5 + 2))
                                     (func_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                      this_00,&local_40);
          iVar1 = kratos::truncate(pcVar8,10);
          local_50 = CONCAT44(extraout_var,iVar1);
          local_40 = kratos::eval_bin_op(left_value,right_value,*(ExprOp *)(p_Var5 + 1),10,false);
          testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)this_00,"gold","result",&local_50,&local_40);
          if ((char)rnd._M_p == '\0') {
            testing::Message::Message((Message *)&result);
            pcVar8 = "";
            if (gtest_ar._0_8_ != 0) {
              pcVar8 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_60,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc"
                       ,0x127,pcVar8);
            testing::internal::AssertHelper::operator=(&local_60,(Message *)&result);
            testing::internal::AssertHelper::~AssertHelper(&local_60);
            if (result != 0) {
              (**(code **)(*(long *)result + 8))();
            }
          }
          if (gtest_ar._0_8_ != 0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&gtest_ar,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         gtest_ar._0_8_);
          }
        }
        lVar2 = lVar2 + 0x10;
      } while (lVar2 != 0x1a48);
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)&func_map);
  }
  std::
  _Rb_tree<kratos::ExprOp,_std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>,_std::_Select1st<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  ::~_Rb_tree((_Rb_tree<kratos::ExprOp,_std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>,_std::_Select1st<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
               *)local_98);
  operator_delete(local_58,0x1a40);
  operator_delete((void *)gold,0x1a40);
  return;
}

Assistant:

TEST(eval, bin_op) {  // NOLINT
    size_t seed = 42;
    std::mt19937 rnd;  // NOLINT
    rnd.seed(seed);
    auto constexpr width = 10;
    auto constexpr mask = UINT64_MASK >> (64u - width);
    auto constexpr num_test = 420u;
    std::vector<std::pair<int64_t, int64_t>> input_pairs(num_test);
    std::vector<std::pair<uint64_t, uint64_t>> eval_pairs(num_test);
    for (uint32_t i = 0; i < num_test; i++) {
        int64_t value1_ = static_cast<int64_t>(rnd() % mask) - mask / 2;
        uint64_t value1 = *(reinterpret_cast<uint64_t *>(&value1_)) & mask;
        int64_t value2_ = 0;
        uint64_t value2 = 0;
        while (value2_ == 0) {
            value2_ = static_cast<int64_t>(rnd() % mask) - mask / 2;
            value2 = *(reinterpret_cast<uint64_t *>(&value2_)) & mask;
        }
        input_pairs[i] = {value1_, value2_};
        eval_pairs[i] = {value1, value2};
    }

    std::map<ExprOp, std::function<int64_t(int64_t, int64_t)>> func_map = {
        {ExprOp::Add, [](int64_t value1, int64_t value2) { return value1 + value2; }},
        {ExprOp::Minus, [](int64_t value1, int64_t value2) { return value1 - value2; }},
        {ExprOp::Multiply, [](int64_t value1, int64_t value2) { return value1 * value2; }},
        {ExprOp::Divide, [](int64_t value1, int64_t value2) { return value1 / value2; }},
        {ExprOp::And, [](int64_t value1, int64_t value2) { return value1 & value2; }},  // NOLINT
        {ExprOp::Or, [](int64_t value1, int64_t value2) { return value1 | value2; }},   // NOLINT
        {ExprOp::Xor, [](int64_t value1, int64_t value2) { return value1 ^ value2; }},  // NOLINT
        {ExprOp::Eq, [](int64_t value1, int64_t value2) { return value1 == value2; }},
        {ExprOp::GreaterEqThan, [](int64_t value1, int64_t value2) { return value1 >= value2; }},
        {ExprOp::GreaterThan, [](int64_t value1, int64_t value2) { return value1 > value2; }},
        {ExprOp::LessEqThan, [](int64_t value1, int64_t value2) { return value1 <= value2; }},
        {ExprOp::LessThan, [](int64_t value1, int64_t value2) { return value1 < value2; }}};

    for (auto const &[op, func] : func_map) {
        // signed
        for (uint64_t i = 0; i < input_pairs.size(); i++) {
            auto const &[v1_, v2_] = input_pairs[i];
            auto const &[v1, v2] = eval_pairs[i];
            auto gold = func(v1_, v2_);
            auto result = eval_bin_op(v1, v2, op, width, true);
            if (gold < 0 || static_cast<uint64_t>(abs(gold)) > mask) {
                gold = (*reinterpret_cast<uint64_t *>(&gold)) & mask;
            }
            EXPECT_EQ(gold, result);
        }
        // unsigned
        for (auto [v1_, v2_] : input_pairs) {
            v1_ += mask / 2;
            v2_ += mask / 2;
            auto v1 = static_cast<uint64_t>(v1_);
            auto v2 = static_cast<uint64_t>(v2_);
            if (v2 == 0) continue;
            auto gold = truncate(func(v1_, v2_), width);
            auto result = eval_bin_op(v1, v2, op, width, false);
            EXPECT_EQ(gold, result);
        }
    }
}